

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# setter_argument_mutator.hpp
# Opt level: O1

StringHolder *
prop::detail::SetterArgumentMutator<StringHolder,_const_char_*,_true>::adapt
          (StringHolder *__return_storage_ptr__,char **value)

{
  allocator local_31;
  long *local_30;
  long local_28;
  long local_20 [2];
  
  std::__cxx11::string::string((string *)&local_30,*value,&local_31);
  (__return_storage_ptr__->string)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->string).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,local_30,local_28 + (long)local_30);
  if (local_30 != local_20) {
    operator_delete(local_30,local_20[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

static SetterType adapt( IncomingType&& value )
  {
    return static_cast< SetterType >( std::move( value ) );
  }